

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O2

void trieste::detail::register_token(TokenDef *def)

{
  char *pcVar1;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
  *this;
  iterator iVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = &token_map()->_M_t;
  pcVar1 = def->name;
  local_60._M_dataplus._M_p = (pointer)strlen(pcVar1);
  local_60._M_string_length = (size_type)pcVar1;
  iVar2 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
          ::find(this,(key_type *)&local_60);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->_M_impl).super__Rb_tree_header) {
    pcVar1 = def->name;
    local_60._M_dataplus._M_p = (pointer)strlen(pcVar1);
    local_60._M_string_length = (size_type)pcVar1;
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
                           *)this,(key_type *)&local_60);
    pmVar3->def = def;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,def->name,&local_61);
  std::operator+(&local_60,"Duplicate token definition: ",&local_40);
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void register_token(const TokenDef& def)
    {
      auto& map = token_map();
      auto it = map.find(def.name);
      if (it != map.end())
        throw std::runtime_error(
          "Duplicate token definition: " + std::string(def.name));

      Token t = def;
      map[t.str()] = t;
    }